

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O2

void deqp::gles3::Functional::DepthStencilCaseUtil::getStencilTestValues
               (int stencilBits,int numValues,int *values)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar5 = (ulong)(uint)numValues;
  uVar3 = 0;
  iVar1 = (int)((long)numValues / 2);
  uVar4 = 0;
  if (0 < iVar1) {
    uVar4 = (long)numValues / 2 & 0xffffffff;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    values[uVar3] = (int)uVar3;
  }
  uVar2 = numValues - iVar1;
  uVar6 = ~(-1 << ((byte)stencilBits & 0x1f));
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
  }
  while( true ) {
    bVar7 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar7) break;
    uVar5 = (ulong)((int)uVar5 + -1);
    values[uVar5] = uVar6;
    uVar6 = uVar6 - 1;
  }
  return;
}

Assistant:

void getStencilTestValues (int stencilBits, int numValues, int* values)
{
	int numLowest		= numValues/2;
	int	numHighest		= numValues-numLowest;
	int	maxVal			= (1<<stencilBits)-1;

	for (int ndx = 0; ndx < numLowest; ndx++)
		values[ndx] = ndx;

	for (int ndx = 0; ndx < numHighest; ndx++)
		values[numValues-ndx-1] = maxVal-ndx;
}